

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int buildCharField(charField *cf,_al_const_bstring b)

{
  int iVar1;
  long lVar2;
  
  iVar1 = -1;
  if (((b != (_al_const_bstring)0x0) && (b->data != (uchar *)0x0)) && (0 < b->slen)) {
    cf->content[0x10] = '\0';
    cf->content[0x11] = '\0';
    cf->content[0x12] = '\0';
    cf->content[0x13] = '\0';
    cf->content[0x14] = '\0';
    cf->content[0x15] = '\0';
    cf->content[0x16] = '\0';
    cf->content[0x17] = '\0';
    cf->content[0x18] = '\0';
    cf->content[0x19] = '\0';
    cf->content[0x1a] = '\0';
    cf->content[0x1b] = '\0';
    cf->content[0x1c] = '\0';
    cf->content[0x1d] = '\0';
    cf->content[0x1e] = '\0';
    cf->content[0x1f] = '\0';
    cf->content[0] = '\0';
    cf->content[1] = '\0';
    cf->content[2] = '\0';
    cf->content[3] = '\0';
    cf->content[4] = '\0';
    cf->content[5] = '\0';
    cf->content[6] = '\0';
    cf->content[7] = '\0';
    cf->content[8] = '\0';
    cf->content[9] = '\0';
    cf->content[10] = '\0';
    cf->content[0xb] = '\0';
    cf->content[0xc] = '\0';
    cf->content[0xd] = '\0';
    cf->content[0xe] = '\0';
    cf->content[0xf] = '\0';
    if (b->slen < 1) {
      return 0;
    }
    iVar1 = 0;
    lVar2 = 0;
    do {
      cf->content[b->data[lVar2] >> 3] =
           cf->content[b->data[lVar2] >> 3] | '\x01' << (b->data[lVar2] & 7);
      lVar2 = lVar2 + 1;
    } while (lVar2 < b->slen);
  }
  return iVar1;
}

Assistant:

static int buildCharField (struct charField * cf, _al_const_bstring b) {
int i;
	if (b == NULL || b->data == NULL || b->slen <= 0) return _AL_BSTR_ERR;
	memset ((void *) cf->content, 0, sizeof (struct charField));
	for (i=0; i < b->slen; i++) {
		setInCharField (cf, b->data[i]);
	}
	return _AL_BSTR_OK;
}